

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_err.cpp
# Opt level: O0

void UCNV_FROM_U_CALLBACK_SUBSTITUTE_63
               (void *context,UConverterFromUnicodeArgs *fromArgs,UChar *codeUnits,int32_t length,
               UChar32 codePoint,UConverterCallbackReason reason,UErrorCode *err)

{
  UConverterCallbackReason reason_local;
  UChar32 codePoint_local;
  int32_t length_local;
  UChar *codeUnits_local;
  UConverterFromUnicodeArgs *fromArgs_local;
  void *context_local;
  
  if ((int)reason < 3) {
    if ((reason == UCNV_UNASSIGNED) &&
       ((((((((codePoint == 0xad || (codePoint == 0x34f)) || (codePoint == 0x61c)) ||
            ((codePoint == 0x115f || (codePoint == 0x1160)))) ||
           (((0x17b3 < codePoint && (codePoint < 0x17b6)) ||
            ((0x180a < codePoint && (codePoint < 0x180f)))))) ||
          ((0x200a < codePoint && (codePoint < 0x2010)))) ||
         ((((0x2029 < codePoint && (codePoint < 0x202f)) ||
           ((0x205f < codePoint && (codePoint < 0x2070)))) ||
          ((codePoint == 0x3164 ||
           (((((0xfdff < codePoint && (codePoint < 0xfe10)) || (codePoint == 0xfeff)) ||
             ((codePoint == 0xffa0 || ((0xffef < codePoint && (codePoint < 0xfff9)))))) ||
            ((0x1bc9f < codePoint && (codePoint < 0x1bca4)))))))))) ||
        (((0x1d172 < codePoint && (codePoint < 0x1d17b)) ||
         ((0xdffff < codePoint && (codePoint < 0xe1000)))))))) {
      *err = U_ZERO_ERROR;
    }
    else if ((context == (void *)0x0) || ((*context == 'i' && (reason == UCNV_UNASSIGNED)))) {
      *err = U_ZERO_ERROR;
      ucnv_cbFromUWriteSub_63(fromArgs,0,err);
    }
  }
  return;
}

Assistant:

U_CAPI void    U_EXPORT2
UCNV_FROM_U_CALLBACK_SUBSTITUTE (
                  const void *context,
                  UConverterFromUnicodeArgs *fromArgs,
                  const UChar* codeUnits,
                  int32_t length,
                  UChar32 codePoint,
                  UConverterCallbackReason reason,
                  UErrorCode * err)
{
    (void)codeUnits;
    (void)length;
    if (reason <= UCNV_IRREGULAR)
    {
        if (reason == UCNV_UNASSIGNED && IS_DEFAULT_IGNORABLE_CODE_POINT(codePoint))
        {
            /*
             * Skip if the codepoint has unicode property of default ignorable.
             */
            *err = U_ZERO_ERROR;
        }
        else if (context == NULL || (*((char*)context) == UCNV_PRV_STOP_ON_ILLEGAL && reason == UCNV_UNASSIGNED))
        {
            *err = U_ZERO_ERROR;
            ucnv_cbFromUWriteSub(fromArgs, 0, err);
        }
        /* else the caller must have set the error code accordingly. */
    }
    /* else ignore the reset, close and clone calls. */
}